

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PresolveComponent.cpp
# Opt level: O1

void __thiscall PresolveComponent::negateReducedLpColDuals(PresolveComponent *this)

{
  pointer pdVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (long)(this->data_).reduced_lp_.num_col_;
  if (0 < lVar2) {
    pdVar1 = (this->data_).recovered_solution_.col_dual.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    lVar3 = 0;
    do {
      pdVar1[lVar3] = -pdVar1[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  return;
}

Assistant:

void PresolveComponent::negateReducedLpColDuals() {
  for (HighsInt col = 0; col < data_.reduced_lp_.num_col_; col++)
    data_.recovered_solution_.col_dual[col] =
        -data_.recovered_solution_.col_dual[col];
  return;
}